

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

void __thiscall
charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>::
do_line(jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>
        *this,sample_type *param_1)

{
  byte bVar1;
  byte bVar2;
  sample_type sVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int qs;
  int start_index;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  if (this->width_ != 0) {
    uVar8 = (uint)*this->previous_line_;
    uVar11 = (uint)this->previous_line_[-1];
    uVar10 = 0;
    do {
      start_index = (int)uVar10;
      lVar9 = (long)start_index;
      bVar1 = this->current_line_[lVar9 + -1];
      bVar2 = this->previous_line_[lVar9 + 1];
      iVar4 = quantize_gradient(this,bVar2 - uVar8);
      uVar12 = uVar8 - uVar11;
      iVar5 = quantize_gradient(this,uVar12);
      uVar7 = (uint)bVar1;
      iVar6 = quantize_gradient(this,uVar11 - uVar7);
      qs = (iVar4 * 9 + iVar5) * 9 + iVar6;
      if (qs == 0) {
        iVar4 = do_run_mode(this,start_index,(decoder_strategy *)0x0);
        uVar7 = iVar4 + start_index;
        uVar11 = (uint)this->previous_line_[(long)(int)uVar7 + -1];
        uVar8 = (uint)this->previous_line_[(int)uVar7];
        uVar10 = (ulong)uVar7;
      }
      else {
        uVar10 = lVar9 + 1;
        if ((int)(uVar12 ^ -(uint)(uVar8 < uVar7)) < 0) {
          uVar12 = 0;
        }
        uVar12 = uVar12 + uVar7;
        if ((int)(uVar11 - uVar7 ^ -(uint)(uVar8 < uVar7)) < 0) {
          uVar12 = uVar8;
        }
        sVar3 = do_regular(this,qs,(uint)this->current_line_[lVar9],uVar12,(decoder_strategy *)0x0);
        this->current_line_[lVar9] = sVar3;
        uVar11 = uVar8;
        uVar8 = (uint)bVar2;
      }
    } while ((uint)uVar10 < this->width_);
  }
  return;
}

Assistant:

FORCE_INLINE void do_line(sample_type* /*template_selector*/)
    {
        int32_t index{};
        int32_t rb{previous_line_[index - 1]};
        int32_t rd{previous_line_[index]};

        while (static_cast<uint32_t>(index) < width_)
        {
            const int32_t ra{current_line_[index - 1]};
            const int32_t rc{rb};
            rb = rd;
            rd = previous_line_[index + 1];

            const int32_t qs{
                compute_context_id(quantize_gradient(rd - rb), quantize_gradient(rb - rc), quantize_gradient(rc - ra))};

            if (qs != 0)
            {
                current_line_[index] =
                    do_regular(qs, current_line_[index], get_predicted_value(ra, rb, rc), static_cast<Strategy*>(nullptr));
                ++index;
            }
            else
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
                rb = previous_line_[index - 1];
                rd = previous_line_[index];
            }
        }
    }